

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O0

exr_result_t
internal_huf_compress
          (uint64_t *encbytes,void *out,uint64_t outsz,uint16_t *raw,uint64_t nRaw,void *spare,
          uint64_t sparebytes)

{
  uint uVar1;
  uint64_t **fHeap_00;
  uint64_t *puVar2;
  uint16_t *in_RCX;
  ulong in_RDX;
  uint32_t *in_RSI;
  long *in_RDI;
  uint64_t in_R8;
  uint64_t *in_R9;
  uint64_t *in_stack_00000008;
  uint8_t *maxcompout;
  uint8_t *tableEnd;
  uint8_t *tableStart;
  uint8_t *compressed;
  uint8_t *dataStart;
  uint32_t dataLength;
  uint32_t nBits;
  uint32_t tableLength;
  uint32_t iM;
  uint32_t im;
  uint64_t *scode;
  uint64_t **fHeap;
  uint32_t *hlink;
  uint64_t *freq;
  exr_result_t rv;
  uint64_t in_stack_ffffffffffffff50;
  uint32_t *hlink_00;
  int iVar3;
  uint32_t *iM_00;
  uint64_t *in_stack_ffffffffffffff80;
  uint32_t local_70;
  uint32_t local_6c;
  uint32_t local_68;
  uint32_t local_64;
  uint64_t *local_60;
  uint64_t *local_58;
  uint64_t *local_50;
  uint64_t *local_48;
  exr_result_t local_3c;
  uint64_t *local_38;
  uint64_t local_30;
  uint16_t *local_28;
  long *local_10;
  exr_result_t local_4;
  
  local_64 = 0;
  local_68 = 0;
  hlink_00 = in_RSI + 5;
  fHeap_00 = (uint64_t **)((long)in_RSI + in_RDX);
  if (in_R8 == 0) {
    *in_RDI = 0;
    local_4 = 0;
  }
  else if (in_RDX < 0x14) {
    local_4 = 3;
  }
  else {
    iM_00 = hlink_00;
    local_38 = in_R9;
    local_30 = in_R8;
    local_28 = in_RCX;
    local_10 = in_RDI;
    puVar2 = (uint64_t *)internal_exr_huf_compress_spare_bytes();
    if (in_stack_00000008 == puVar2) {
      local_48 = local_38;
      local_60 = local_38 + 0x10001;
      local_58 = local_38 + 0x20002;
      local_50 = local_38 + 0x30003;
      countFrequencies((uint64_t *)fHeap_00,(uint16_t *)in_stack_00000008,in_stack_ffffffffffffff50)
      ;
      hufBuildEncTable(in_stack_ffffffffffffff80,in_RSI,iM_00,hlink_00,fHeap_00,in_stack_00000008);
      iVar3 = (int)iM_00;
      local_3c = hufPackEncTable(local_48,local_64,local_68,(uint8_t **)&stack0xffffffffffffff68,
                                 (uint8_t *)fHeap_00);
      local_4 = local_3c;
      if (local_3c == 0) {
        local_6c = (int)hlink_00 - iVar3;
        local_3c = hufEncode(local_48,local_28,local_30,local_68,(uint8_t *)hlink_00,
                             (uint8_t *)fHeap_00,&local_70);
        local_4 = local_3c;
        if (local_3c == 0) {
          uVar1 = local_70 + 7;
          writeUInt((uint8_t *)in_RSI,local_64);
          writeUInt((uint8_t *)(in_RSI + 1),local_68);
          writeUInt((uint8_t *)(in_RSI + 2),local_6c);
          writeUInt((uint8_t *)(in_RSI + 3),local_70);
          writeUInt((uint8_t *)(in_RSI + 4),0);
          *local_10 = (long)hlink_00 + ((ulong)(uVar1 >> 3) - (long)in_RSI);
          local_4 = 0;
        }
      }
    }
    else {
      local_4 = 3;
    }
  }
  return local_4;
}

Assistant:

exr_result_t
internal_huf_compress (
    uint64_t*       encbytes,
    void*           out,
    uint64_t        outsz,
    const uint16_t* raw,
    uint64_t        nRaw,
    void*           spare,
    uint64_t        sparebytes)
{
    exr_result_t rv;
    uint64_t*    freq;
    uint32_t*    hlink;
    uint64_t**   fHeap;
    uint64_t*    scode;
    uint32_t     im = 0;
    uint32_t     iM = 0;
    uint32_t     tableLength, nBits, dataLength;
    uint8_t*     dataStart;
    uint8_t*     compressed = (uint8_t*) out;
    uint8_t*     tableStart = compressed + 20;
    uint8_t*     tableEnd   = tableStart;
    uint8_t*     maxcompout = compressed + outsz;

    if (nRaw == 0)
    {
        *encbytes = 0;
        return EXR_ERR_SUCCESS;
    }

    if (outsz < 20) return EXR_ERR_INVALID_ARGUMENT;
    if (sparebytes != internal_exr_huf_compress_spare_bytes ())
        return EXR_ERR_INVALID_ARGUMENT;

    freq  = (uint64_t*) spare;
    scode = freq + HUF_ENCSIZE;
    fHeap = (uint64_t**) (scode + HUF_ENCSIZE);
    hlink = (uint32_t*) (fHeap + HUF_ENCSIZE);

    countFrequencies (freq, raw, nRaw);

    hufBuildEncTable (freq, &im, &iM, hlink, fHeap, scode);

    rv = hufPackEncTable (freq, im, iM, &tableEnd, maxcompout);

    if (rv != EXR_ERR_SUCCESS) return rv;
    tableLength =
        (uint32_t) (((uintptr_t) tableEnd) - ((uintptr_t) tableStart));
    dataStart = tableEnd;

    rv = hufEncode (freq, raw, nRaw, iM, dataStart, maxcompout, &nBits);
    if (rv != EXR_ERR_SUCCESS) return rv;

    dataLength = (nBits + 7) / 8;

    writeUInt (compressed, im);
    writeUInt (compressed + 4, iM);
    writeUInt (compressed + 8, tableLength);
    writeUInt (compressed + 12, nBits);
    writeUInt (compressed + 16, 0); // room for future extensions

    *encbytes =
        (((uintptr_t) dataStart) + ((uintptr_t) dataLength) -
         ((uintptr_t) compressed));
    return EXR_ERR_SUCCESS;
}